

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.c
# Opt level: O0

ZyanStatus
ZyanStringAppendDecS
          (ZyanString *string,ZyanI64 value,ZyanU8 padding_length,ZyanBool force_sign,
          ZyanStringView *prefix)

{
  ZyanStatus ZVar1;
  ZyanU64 value_00;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZyanStringView *prefix_local;
  ZyanBool force_sign_local;
  ZyanU8 padding_length_local;
  ZyanI64 value_local;
  ZyanString *string_local;
  
  if (value < 0) {
    string_local._4_4_ = ZyanStringAppend(string,&STR_SUB);
    if (((string_local._4_4_ & 0x80000000) == 0) &&
       ((prefix == (ZyanStringView *)0x0 ||
        (string_local._4_4_ = ZyanStringAppend(string,prefix),
        (string_local._4_4_ & 0x80000000) == 0)))) {
      value_00 = ZyanAbsI64(value);
      string_local._4_4_ = ZyanStringAppendDecU(string,value_00,padding_length);
    }
  }
  else {
    if (force_sign != '\0') {
      if (value < 0) {
        __assert_fail("value >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Format.c"
                      ,0x1c5,
                      "ZyanStatus ZyanStringAppendDecS(ZyanString *, ZyanI64, ZyanU8, ZyanBool, const ZyanStringView *)"
                     );
      }
      ZVar1 = ZyanStringAppend(string,&STR_ADD);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
    }
    if ((prefix == (ZyanStringView *)0x0) ||
       (string_local._4_4_ = ZyanStringAppend(string,prefix), (string_local._4_4_ & 0x80000000) == 0
       )) {
      string_local._4_4_ = ZyanStringAppendDecU(string,value,padding_length);
    }
  }
  return string_local._4_4_;
}

Assistant:

ZyanStatus ZyanStringAppendDecS(ZyanString* string, ZyanI64 value, ZyanU8 padding_length,
    ZyanBool force_sign, const ZyanStringView* prefix)
{
    if (value < 0)
    {
        ZYAN_CHECK(ZyanStringAppend(string, &STR_SUB));
        if (prefix)
        {
            ZYAN_CHECK(ZyanStringAppend(string, prefix));
        }
        return ZyanStringAppendDecU(string, ZyanAbsI64(value), padding_length);
    }

    if (force_sign)
    {
        ZYAN_ASSERT(value >= 0);
        ZYAN_CHECK(ZyanStringAppend(string, &STR_ADD));
    }

    if (prefix)
    {
        ZYAN_CHECK(ZyanStringAppend(string, prefix));
    }
    return ZyanStringAppendDecU(string, value, padding_length);
}